

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noui.cpp
# Opt level: O3

bool noui_ThreadSafeMessageBox(bilingual_str *message,string *caption,uint style)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  Level level;
  int source_line;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  string strCaption;
  undefined1 local_78 [24];
  code *local_60;
  code *local_58;
  bilingual_str *local_50;
  code *local_48;
  code *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &strCaption.field_2;
  strCaption._M_string_length = 0;
  strCaption.field_2._M_local_buf[0] = '\0';
  uVar3 = style & 0xbfffffff;
  strCaption._M_dataplus._M_p = (pointer)paVar1;
  if (uVar3 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&strCaption,0,0,"Information: ",0xd);
    if ((style >> 0x1e & 1) != 0) goto LAB_00971eed;
    level = Info;
    source_line = 0x27;
  }
  else if (uVar3 == 0x10000401) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&strCaption,0,0,"Warning: ",9);
    if ((style >> 0x1e & 1) != 0) goto LAB_00971eed;
    level = Warning;
    source_line = 0x23;
  }
  else {
    if (uVar3 != 0x10000402) {
      pcVar2 = (caption->_M_dataplus)._M_p;
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar2,pcVar2 + caption->_M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,": ")
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&strCaption,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if ((style >> 0x1e & 1) == 0) {
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/noui.cpp"
        ;
        source_file_00._M_len = 0x58;
        logging_function_00._M_str = "noui_ThreadSafeMessageBox";
        logging_function_00._M_len = 0x19;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0x2b,ALL,Info,
                   (ConstevalFormatString<2U>)0x10dce2e,&strCaption,&message->original);
      }
      goto LAB_00971eed;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&strCaption,0,0,"Error: ",7);
    if ((style >> 0x1e & 1) != 0) goto LAB_00971eed;
    level = Error;
    source_line = 0x1f;
  }
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/noui.cpp";
  source_file._M_len = 0x58;
  logging_function._M_str = "noui_ThreadSafeMessageBox";
  logging_function._M_len = 0x19;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,source_line,ALL,level,(ConstevalFormatString<1U>)0x112ee54
             ,&message->original);
LAB_00971eed:
  local_78._0_8_ = local_78 + 0x10;
  local_78._8_4_ = 2;
  local_60 = tinyformat::detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_58 = tinyformat::detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_48 = tinyformat::detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_40 = tinyformat::detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_78._16_8_ = &strCaption;
  local_50 = message;
  tinyformat::detail::formatImpl((ostream *)&std::cerr,"%s%s\n",(FormatArg *)local_78._0_8_,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)strCaption._M_dataplus._M_p != paVar1) {
    operator_delete(strCaption._M_dataplus._M_p,
                    CONCAT71(strCaption.field_2._M_allocated_capacity._1_7_,
                             strCaption.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool noui_ThreadSafeMessageBox(const bilingual_str& message, const std::string& caption, unsigned int style)
{
    bool fSecure = style & CClientUIInterface::SECURE;
    style &= ~CClientUIInterface::SECURE;

    std::string strCaption;
    switch (style) {
    case CClientUIInterface::MSG_ERROR:
        strCaption = "Error: ";
        if (!fSecure) LogError("%s\n", message.original);
        break;
    case CClientUIInterface::MSG_WARNING:
        strCaption = "Warning: ";
        if (!fSecure) LogWarning("%s\n", message.original);
        break;
    case CClientUIInterface::MSG_INFORMATION:
        strCaption = "Information: ";
        if (!fSecure) LogInfo("%s\n", message.original);
        break;
    default:
        strCaption = caption + ": "; // Use supplied caption (can be empty)
        if (!fSecure) LogInfo("%s%s\n", strCaption, message.original);
    }

    tfm::format(std::cerr, "%s%s\n", strCaption, message.original);
    return false;
}